

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctaes.c
# Opt level: O1

void AES_decrypt(uchar *in,uchar *out,AES_KEY *key)

{
  char cVar1;
  short sVar9;
  short sVar10;
  short sVar11;
  ushort uVar12;
  ushort uVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  undefined1 auVar18 [14];
  undefined1 auVar19 [14];
  undefined1 auVar20 [14];
  undefined1 auVar21 [16];
  undefined1 auVar22 [14];
  undefined1 auVar23 [14];
  undefined1 auVar24 [12];
  unkbyte10 Var25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int b;
  int iVar30;
  uchar *in_RCX;
  int iVar31;
  uchar *puVar32;
  long lVar33;
  uchar *puVar34;
  long in_FS_OFFSET;
  short sVar35;
  undefined4 uVar51;
  undefined1 auVar38 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  ulong uVar54;
  AES_state s;
  AES_state local_48;
  long local_38;
  char cVar2;
  char cVar3;
  char cVar4;
  byte bVar5;
  byte bVar6;
  char cVar7;
  char cVar8;
  undefined6 uVar36;
  undefined1 auVar37 [14];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar39 [16];
  undefined1 auVar47 [16];
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.slice[0] = 0;
  local_48.slice[1] = 0;
  local_48.slice[2] = 0;
  local_48.slice[3] = 0;
  local_48.slice[4] = 0;
  local_48.slice[5] = 0;
  local_48.slice[6] = 0;
  local_48.slice[7] = 0;
  lVar33 = ((ulong)out & 0xffffffff) * 0x10;
  puVar34 = in + lVar33;
  LoadBytes(&local_48,in_RCX);
  local_48.slice._0_8_ = *(ulong *)(in + lVar33) ^ local_48.slice._0_8_;
  local_48.slice._8_8_ = *(ulong *)((long)(in + lVar33) + 8) ^ local_48.slice._8_8_;
  if (1 < (int)out) {
    iVar31 = (int)out + -1;
    puVar32 = puVar34;
    do {
      puVar34 = puVar32 + -0x10;
      InvShiftRows(&local_48);
      SubBytes(&local_48,1);
      local_48.slice._0_8_ = *(ulong *)(puVar32 + -0x10) ^ local_48.slice._0_8_;
      local_48.slice._8_8_ = *(ulong *)(puVar32 + -8) ^ local_48.slice._8_8_;
      MixColumns(&local_48,1);
      iVar31 = iVar31 + -1;
      puVar32 = puVar34;
    } while (iVar31 != 0);
  }
  InvShiftRows(&local_48);
  SubBytes(&local_48,1);
  auVar29 = _DAT_0117c310;
  auVar28 = _DAT_0117c300;
  auVar27 = _DAT_0117c2f0;
  auVar26 = _DAT_0117c2e0;
  lVar33 = 0;
  do {
    local_48.slice[lVar33] = local_48.slice[lVar33] ^ *(ushort *)(puVar34 + lVar33 * 2 + -0x10);
    lVar33 = lVar33 + 1;
  } while (lVar33 != 8);
  iVar31 = 0;
  do {
    iVar30 = 0;
    do {
      auVar21._8_2_ = local_48.slice[4];
      auVar21._10_2_ = local_48.slice[5];
      auVar21._12_2_ = local_48.slice[6];
      auVar21._14_2_ = local_48.slice[7];
      auVar21._0_2_ = local_48.slice[0];
      auVar21._2_2_ = local_48.slice[1];
      auVar21._4_2_ = local_48.slice[2];
      auVar21._6_2_ = local_48.slice[3];
      auVar18._10_2_ = 0;
      auVar18._0_10_ = auVar21._0_10_;
      auVar18._12_2_ = local_48.slice[3];
      auVar19._8_2_ = local_48.slice[2];
      auVar19._0_2_ = local_48.slice[0];
      auVar19._2_2_ = local_48.slice[1];
      auVar19._4_2_ = local_48.slice[2];
      auVar19._6_2_ = local_48.slice[3];
      auVar19._10_4_ = auVar18._10_4_;
      auVar22._6_8_ = 0;
      auVar22._0_6_ = auVar19._8_6_;
      auVar20._4_2_ = local_48.slice[1];
      auVar20._0_4_ = local_48.slice._0_4_;
      auVar20._6_8_ = SUB148(auVar22 << 0x40,6);
      uVar54 = (ulong)(uint)(iVar31 + iVar30);
      auVar38._0_4_ = (local_48.slice._0_4_ & 0xffff) >> uVar54;
      auVar38._4_4_ = auVar20._4_4_ >> uVar54;
      auVar38._8_4_ = auVar19._8_4_ >> uVar54;
      auVar38._12_2_ = local_48.slice[3] >> uVar54;
      auVar38._14_2_ = 0;
      auVar52._2_2_ = 0;
      auVar52._0_2_ = local_48.slice[4] >> uVar54;
      auVar52._4_2_ = local_48.slice[5] >> uVar54;
      auVar52._6_2_ = 0;
      auVar52._8_2_ = local_48.slice[6] >> uVar54;
      auVar52._10_2_ = 0;
      auVar52._12_2_ = local_48.slice[7] >> uVar54;
      auVar52._14_2_ = 0;
      auVar52 = auVar52 & auVar26;
      auVar38 = auVar38 & auVar26;
      sVar9 = auVar38._0_2_;
      cVar1 = (0 < sVar9) * (sVar9 < 0x100) * auVar38[0] - (0xff < sVar9);
      sVar9 = auVar38._2_2_;
      sVar35 = CONCAT11((0 < sVar9) * (sVar9 < 0x100) * auVar38[2] - (0xff < sVar9),cVar1);
      sVar9 = auVar38._4_2_;
      cVar2 = (0 < sVar9) * (sVar9 < 0x100) * auVar38[4] - (0xff < sVar9);
      sVar9 = auVar38._6_2_;
      uVar51 = CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar38[6] - (0xff < sVar9),
                        CONCAT12(cVar2,sVar35));
      sVar9 = auVar38._8_2_;
      cVar3 = (0 < sVar9) * (sVar9 < 0x100) * auVar38[8] - (0xff < sVar9);
      sVar9 = auVar38._10_2_;
      uVar36 = CONCAT15((0 < sVar9) * (sVar9 < 0x100) * auVar38[10] - (0xff < sVar9),
                        CONCAT14(cVar3,uVar51));
      sVar9 = auVar38._12_2_;
      cVar4 = (0 < sVar9) * (sVar9 < 0x100) * auVar38[0xc] - (0xff < sVar9);
      sVar9 = auVar38._14_2_;
      auVar37._0_8_ =
           CONCAT17((0 < sVar9) * (sVar9 < 0x100) * auVar38[0xe] - (0xff < sVar9),
                    CONCAT16(cVar4,uVar36));
      sVar9 = auVar52._0_2_;
      bVar5 = (0 < sVar9) * (sVar9 < 0x100) * auVar52[0] - (0xff < sVar9);
      auVar37[8] = bVar5;
      auVar37[9] = 0;
      sVar9 = auVar52._4_2_;
      bVar6 = (0 < sVar9) * (sVar9 < 0x100) * auVar52[4] - (0xff < sVar9);
      auVar37[10] = bVar6;
      auVar37[0xb] = 0;
      sVar9 = auVar52._8_2_;
      cVar7 = (0 < sVar9) * (sVar9 < 0x100) * auVar52[8] - (0xff < sVar9);
      auVar37[0xc] = cVar7;
      sVar9 = auVar52._10_2_;
      auVar37[0xd] = (0 < sVar9) * (sVar9 < 0x100) * auVar52[10] - (0xff < sVar9);
      sVar9 = auVar52._12_2_;
      cVar8 = (0 < sVar9) * (sVar9 < 0x100) * auVar52[0xc] - (0xff < sVar9);
      auVar39[0xe] = cVar8;
      auVar39._0_14_ = auVar37;
      sVar9 = auVar52._14_2_;
      auVar39[0xf] = (0 < sVar9) * (sVar9 < 0x100) * auVar52[0xe] - (0xff < sVar9);
      sVar9 = (short)((uint)uVar51 >> 0x10);
      auVar40[1] = (0 < sVar9) * (sVar9 < 0x100) * cVar2 - (0xff < sVar9);
      auVar40[0] = (0 < sVar35) * (sVar35 < 0x100) * cVar1 - (0xff < sVar35);
      sVar10 = (short)((uint6)uVar36 >> 0x20);
      auVar40[2] = (0 < sVar10) * (sVar10 < 0x100) * cVar3 - (0xff < sVar10);
      sVar11 = (short)((ulong)auVar37._0_8_ >> 0x30);
      auVar40[3] = (0 < sVar11) * (sVar11 < 0x100) * cVar4 - (0xff < sVar11);
      uVar12 = (ushort)bVar5;
      auVar40[4] = (bVar5 != 0) * (uVar12 < 0x100) * bVar5 - (0xff < uVar12);
      uVar13 = (ushort)bVar6;
      auVar40[5] = (bVar6 != 0) * (uVar13 < 0x100) * bVar6 - (0xff < uVar13);
      sVar14 = auVar37._12_2_;
      auVar40[6] = (0 < sVar14) * (sVar14 < 0x100) * cVar7 - (0xff < sVar14);
      sVar16 = auVar39._14_2_;
      auVar40[7] = (0 < sVar16) * (sVar16 < 0x100) * cVar8 - (0xff < sVar16);
      auVar40[8] = (0 < sVar35) * (sVar35 < 0x100) * cVar1 - (0xff < sVar35);
      auVar40[9] = (0 < sVar9) * (sVar9 < 0x100) * cVar2 - (0xff < sVar9);
      auVar40[10] = (0 < sVar10) * (sVar10 < 0x100) * cVar3 - (0xff < sVar10);
      auVar40[0xb] = (0 < sVar11) * (sVar11 < 0x100) * cVar4 - (0xff < sVar11);
      auVar40[0xc] = (bVar5 != 0) * (uVar12 < 0x100) * bVar5 - (0xff < uVar12);
      auVar40[0xd] = (bVar6 != 0) * (uVar13 < 0x100) * bVar6 - (0xff < uVar13);
      auVar40[0xe] = (0 < sVar14) * (sVar14 < 0x100) * cVar7 - (0xff < sVar14);
      auVar40[0xf] = (0 < sVar16) * (sVar16 < 0x100) * cVar8 - (0xff < sVar16);
      auVar40 = auVar40 & auVar27;
      auVar47._0_14_ = auVar40._0_14_;
      auVar47[0xe] = auVar40[7];
      auVar47[0xf] = auVar40[7];
      auVar46._14_2_ = auVar47._14_2_;
      auVar46._0_13_ = auVar40._0_13_;
      auVar46[0xd] = auVar40[6];
      auVar45._13_3_ = auVar46._13_3_;
      auVar45._0_12_ = auVar40._0_12_;
      auVar45[0xc] = auVar40[6];
      auVar44._12_4_ = auVar45._12_4_;
      auVar44._0_11_ = auVar40._0_11_;
      auVar44[0xb] = auVar40[5];
      auVar43._11_5_ = auVar44._11_5_;
      auVar43._0_10_ = auVar40._0_10_;
      auVar43[10] = auVar40[5];
      auVar42._10_6_ = auVar43._10_6_;
      auVar42._0_9_ = auVar40._0_9_;
      auVar42[9] = auVar40[4];
      auVar41._9_7_ = auVar42._9_7_;
      auVar41._0_8_ = auVar40._0_8_;
      auVar41[8] = auVar40[4];
      Var25 = CONCAT91(CONCAT81(auVar41._8_8_,auVar40[3]),auVar40[3]);
      auVar24._2_10_ = Var25;
      auVar24[1] = auVar40[2];
      auVar24[0] = auVar40[2];
      auVar23._2_12_ = auVar24;
      auVar23[1] = auVar40[1];
      auVar23[0] = auVar40[1];
      auVar48._0_2_ = CONCAT11(auVar40[0],auVar40[0]) * auVar28._0_2_;
      auVar48._2_2_ = auVar23._0_2_ * auVar28._2_2_;
      auVar48._4_2_ = auVar24._0_2_ * auVar28._4_2_;
      auVar48._6_2_ = (short)Var25 * auVar28._6_2_;
      auVar48._8_2_ = auVar41._8_2_ * auVar28._8_2_;
      auVar48._10_2_ = auVar43._10_2_ * auVar28._10_2_;
      auVar48._12_2_ = auVar45._12_2_ * auVar28._12_2_;
      auVar48._14_2_ = auVar46._14_2_ * auVar28._14_2_;
      auVar48 = auVar48 & auVar29;
      sVar9 = auVar48._0_2_;
      sVar10 = auVar48._2_2_;
      sVar11 = auVar48._4_2_;
      sVar14 = auVar48._6_2_;
      sVar16 = auVar48._8_2_;
      sVar35 = auVar48._10_2_;
      sVar15 = auVar48._12_2_;
      sVar17 = auVar48._14_2_;
      auVar49._0_8_ =
           CONCAT17((0 < sVar17) * (sVar17 < 0x100) * auVar48[0xe] - (0xff < sVar17),
                    CONCAT16((0 < sVar15) * (sVar15 < 0x100) * auVar48[0xc] - (0xff < sVar15),
                             CONCAT15((0 < sVar35) * (sVar35 < 0x100) * auVar48[10] -
                                      (0xff < sVar35),
                                      CONCAT14((0 < sVar16) * (sVar16 < 0x100) * auVar48[8] -
                                               (0xff < sVar16),
                                               CONCAT13((0 < sVar14) * (sVar14 < 0x100) * auVar48[6]
                                                        - (0xff < sVar14),
                                                        CONCAT12((0 < sVar11) * (sVar11 < 0x100) *
                                                                 auVar48[4] - (0xff < sVar11),
                                                                 CONCAT11((0 < sVar10) *
                                                                          (sVar10 < 0x100) *
                                                                          auVar48[2] -
                                                                          (0xff < sVar10),
                                                                          (0 < sVar9) *
                                                                          (sVar9 < 0x100) *
                                                                          auVar48[0] -
                                                                          (0xff < sVar9))))))));
      auVar49._8_8_ = 0;
      uVar51 = (undefined4)(auVar49._0_8_ >> 0x20);
      auVar53._4_4_ = uVar51;
      auVar53._0_4_ = uVar51;
      auVar53._8_4_ = uVar51;
      auVar53._12_4_ = uVar51;
      auVar53 = auVar53 | auVar49;
      auVar50._0_4_ = auVar53._0_4_ >> 0x10;
      auVar50._4_4_ = 0;
      auVar50._8_4_ = auVar53._8_4_ >> 0x10;
      auVar50._12_4_ = auVar53._12_4_ >> 0x10;
      *(byte *)key->rd_key = SUB161(auVar50 | auVar53,1) | SUB161(auVar50 | auVar53,0);
      key = (AES_KEY *)((long)key->rd_key + 1);
      iVar30 = iVar30 + 4;
    } while (iVar30 != 0x10);
    iVar31 = iVar31 + 1;
  } while (iVar31 != 4);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void AES_decrypt(const AES_state* rounds, int nrounds, unsigned char* plain16, const unsigned char* cipher16) {
    /* Most AES decryption implementations use the alternate scheme
     * (the Equivalent Inverse Cipher), which allows for more code reuse between
     * the encryption and decryption code, but requires separate setup for both.
     */
    AES_state s = {{0}};
    int round;

    rounds += nrounds;

    LoadBytes(&s, cipher16);
    AddRoundKey(&s, rounds--);

    for (round = 1; round < nrounds; round++) {
        InvShiftRows(&s);
        SubBytes(&s, 1);
        AddRoundKey(&s, rounds--);
        MixColumns(&s, 1);
    }

    InvShiftRows(&s);
    SubBytes(&s, 1);
    AddRoundKey(&s, rounds);

    SaveBytes(plain16, &s);
}